

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushStyleColor(ImGuiCol idx,ImU32 col)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  ImVec4 *pIVar4;
  int in_EDI;
  undefined1 auVar5 [64];
  undefined8 in_XMM1_Qb;
  ImVec4 IVar7;
  ImGuiColorMod backup;
  ImGuiContext *g;
  ImGuiColorMod *in_stack_ffffffffffffffb8;
  ImVector<ImGuiColorMod> *this;
  undefined1 local_24 [20];
  ImGuiContext *local_10;
  int local_4;
  undefined1 auVar6 [56];
  
  local_10 = GImGui;
  this = (ImVector<ImGuiColorMod> *)local_24;
  local_4 = in_EDI;
  ImGuiColorMod::ImGuiColorMod((ImGuiColorMod *)0x544a0a);
  local_24._0_4_ = local_4;
  pIVar4 = (local_10->Style).Colors + local_4;
  local_24._4_8_ = *(undefined8 *)pIVar4;
  local_24._12_4_ = pIVar4->z;
  local_24._16_4_ = pIVar4->w;
  auVar6 = ZEXT856((ulong)local_24._12_8_);
  ImVector<ImGuiColorMod>::push_back(this,in_stack_ffffffffffffffb8);
  IVar7 = ColorConvertU32ToFloat4(0);
  auVar5._0_8_ = IVar7._0_8_;
  auVar5._8_56_ = auVar6;
  uVar1 = vmovlpd_avx(auVar5._0_16_);
  auVar3._8_8_ = in_XMM1_Qb;
  auVar3._0_8_ = IVar7._8_8_;
  uVar2 = vmovlpd_avx(auVar3);
  pIVar4 = (local_10->Style).Colors + local_4;
  pIVar4->x = (float)(int)uVar1;
  pIVar4->y = (float)(int)((ulong)uVar1 >> 0x20);
  pIVar4->z = (float)(int)uVar2;
  pIVar4->w = (float)(int)((ulong)uVar2 >> 0x20);
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, ImU32 col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorStack.push_back(backup);
    g.Style.Colors[idx] = ColorConvertU32ToFloat4(col);
}